

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall
DSectorPlaneInterpolation::DSectorPlaneInterpolation
          (DSectorPlaneInterpolation *this,sector_t *_sector,bool _plane,bool attach)

{
  double dVar1;
  secplane_t *psVar2;
  splane *psVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  bool bVar4;
  
  DObject::DObject((DObject *)this);
  (this->super_DInterpolation).Next.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  (this->super_DInterpolation).refcount = 0;
  (this->super_DInterpolation).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008903b0;
  (this->attached).Array = (DInterpolation **)0x0;
  (this->attached).Most = 0;
  (this->attached).Count = 0;
  this->sector = _sector;
  this->ceiling = _plane;
  bVar4 = (int)CONCAT71(in_register_00000011,_plane) != 0;
  psVar2 = &_sector->floorplane;
  if (bVar4) {
    psVar2 = &_sector->ceilingplane;
  }
  psVar3 = _sector->planes + 1;
  if (!bVar4) {
    psVar3 = _sector->planes;
  }
  dVar1 = psVar3->TexZ;
  this->oldheight = psVar2->D;
  this->oldtexz = dVar1;
  if ((int)CONCAT71(in_register_00000009,attach) != 0) {
    P_Start3dMidtexInterpolations(&this->attached,_sector,_plane);
    P_StartLinkedSectorInterpolations(&this->attached,this->sector,this->ceiling);
  }
  (this->super_DInterpolation).Next.field_0 = interpolator.Head.field_0;
  if ((interpolator.Head.field_0 != (DInterpolation *)0x0) &&
     ((*(byte *)((long)interpolator.Head.field_0 + 0x20) & 0x20) == 0)) {
    *(DSectorPlaneInterpolation **)((long)interpolator.Head.field_0 + 0x30) = this;
  }
  (this->super_DInterpolation).Prev.field_0.p = (DInterpolation *)0x0;
  interpolator.Head.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)this;
  interpolator.count = interpolator.count + 1;
  return;
}

Assistant:

DSectorPlaneInterpolation::DSectorPlaneInterpolation(sector_t *_sector, bool _plane, bool attach)
{
	sector = _sector;
	ceiling = _plane;
	UpdateInterpolation ();

	if (attach)
	{
		P_Start3dMidtexInterpolations(attached, sector, ceiling);
		P_StartLinkedSectorInterpolations(attached, sector, ceiling);
	}
	interpolator.AddInterpolation(this);
}